

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O2

void __thiscall
LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::~LinkedListPool
          (LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  
  ppTVar1 = (this->v_).
            super__Vector_base<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar2 = (this->v_).
                 super__Vector_base<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppTVar2 != ppTVar1;
      ppTVar2 = ppTVar2 + 1) {
    ::free(*ppTVar2);
  }
  std::
  _Vector_base<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
  ::~_Vector_base((_Vector_base<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
                   *)this);
  return;
}

Assistant:

~LinkedListPool()
  {
    typename vector_t::const_iterator const itend = v_.end();
    for(typename vector_t::const_iterator it = v_.begin(); it != itend; ++it)
      PoolAllocator_malloc_free<SCALABLE>::free(reinterpret_cast<char*>(*it));
  }